

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

int32_t __thiscall icu_63::FCDUTF16CollationIterator::getOffset(FCDUTF16CollationIterator *this)

{
  UChar *pUVar1;
  UChar *pUVar2;
  
  if (this->checkDir == '\0') {
    pUVar1 = (this->super_UTF16CollationIterator).start;
    pUVar2 = this->segmentStart;
    if (pUVar1 != pUVar2) {
      if ((this->super_UTF16CollationIterator).pos != pUVar1) {
        pUVar2 = this->segmentLimit;
      }
      goto LAB_00221014;
    }
  }
  pUVar2 = (this->super_UTF16CollationIterator).pos;
LAB_00221014:
  return (int32_t)((ulong)((long)pUVar2 - (long)this->rawStart) >> 1);
}

Assistant:

int32_t
FCDUTF16CollationIterator::getOffset() const {
    if(checkDir != 0 || start == segmentStart) {
        return (int32_t)(pos - rawStart);
    } else if(pos == start) {
        return (int32_t)(segmentStart - rawStart);
    } else {
        return (int32_t)(segmentLimit - rawStart);
    }
}